

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O2

string * __thiscall
FMB::FiniteModelMultiSorted::prepend
          (string *__return_storage_ptr__,FiniteModelMultiSorted *this,char *prefix,string *name)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_79;
  string dequoted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,prefix,(allocator<char> *)&dequoted);
  }
  else {
    cVar1 = *(name->_M_dataplus)._M_p;
    if (cVar1 == '\'') {
      std::__cxx11::string::substr((ulong)&dequoted,(ulong)name);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"\'",&local_79);
      std::operator+(&local_38,&local_58,prefix);
      std::operator+(__return_storage_ptr__,&local_38,&dequoted);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      this_00 = &dequoted;
    }
    else {
      if (cVar1 != '$') {
        std::operator+(__return_storage_ptr__,prefix,name);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"\'",&local_79);
      std::operator+(&local_38,&local_58,prefix);
      std::operator+(&dequoted,&local_38,name);
      std::operator+(__return_storage_ptr__,&dequoted,"\'");
      std::__cxx11::string::~string((string *)&dequoted);
      std::__cxx11::string::~string((string *)&local_38);
      this_00 = &local_58;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string prepend(const char* prefix, std::string name) {
    if (name.empty()) {
      return std::string(prefix);
    } else if(name[0] == '$') {
      return std::string("'") + prefix + name + "'";
    } else if (name[0] == '\'') {
      std::string dequoted = name.substr(1, name.length() - 1);
      return std::string("'") + prefix + dequoted;
    } else {
      return prefix + name;
    }
  }